

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp)

{
  undefined8 uVar1;
  uint uVar2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT tries;
  REF_BOOL increase_fuzz;
  REF_NODE to_node;
  REF_MPI ref_mpi;
  REF_INTERP ref_interp_local;
  
  to_node = (REF_NODE)ref_interp->ref_mpi;
  _tries = ref_interp->to_grid->node;
  ref_mpi = (REF_MPI)ref_interp;
  if ((ref_interp->instrument == 0) ||
     (uVar2 = ref_mpi_stopwatch_start((REF_MPI)to_node), uVar2 == 0)) {
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < _tries->max;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      if (((((-1 < ref_private_macro_code_rss_1) && (ref_private_macro_code_rss_1 < _tries->max)) &&
           (-1 < _tries->global[ref_private_macro_code_rss_1])) &&
          ((_tries->ref_mpi->id == _tries->part[ref_private_macro_code_rss_1] &&
           (*(int *)(*(long *)&ref_mpi[1].native_alltoallv + (long)ref_private_macro_code_rss_1 * 4)
            != -1)))) &&
         (uVar2 = ref_interp_push_onto_queue((REF_INTERP)ref_mpi,ref_private_macro_code_rss_1),
         uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x6e2,"ref_interp_locate_warm",(ulong)uVar2,"queue neighbors");
        return uVar2;
      }
    }
    uVar2 = ref_interp_process_agents((REF_INTERP)ref_mpi);
    if (uVar2 == 0) {
      if ((ref_mpi->timing == 0) ||
         (uVar2 = ref_mpi_stopwatch_stop((REF_MPI)to_node,"drain"), uVar2 == 0)) {
        node = 0;
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 0xc;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          if ((node != 0) &&
             (*(double *)&ref_mpi[2].native_alltoallv =
                   *(double *)&ref_mpi[2].native_alltoallv * 10.0, to_node->max == 0)) {
            uVar1._0_4_ = ref_mpi[2].native_alltoallv;
            uVar1._4_4_ = ref_mpi[2].debug;
            printf("retry tree search with %e fuzz\n",uVar1);
          }
          uVar2 = ref_interp_tree((REF_INTERP)ref_mpi,&node);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x6f2,"ref_interp_locate_warm",(ulong)uVar2,"tree");
            return uVar2;
          }
          if ((ref_mpi->timing != 0) &&
             (uVar2 = ref_mpi_stopwatch_stop((REF_MPI)to_node,"tree"), uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x6f4,"ref_interp_locate_warm",(ulong)uVar2,"locate clock");
            return uVar2;
          }
          if (node == 0) break;
        }
        if ((long)node == 0) {
          ref_interp_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x6f7,"ref_interp_locate_warm","unable to grow fuzz to find tree candidate",0,
                 (long)node);
          ref_interp_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x6e8,"ref_interp_locate_warm",(ulong)uVar2,"locate clock");
        ref_interp_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x6e6,"ref_interp_locate_warm",(ulong)uVar2,"drain");
      ref_interp_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x6de,
           "ref_interp_locate_warm",(ulong)uVar2,"locate clock");
    ref_interp_local._4_4_ = uVar2;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_BOOL increase_fuzz;
  REF_INT tries;
  REF_INT node;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    }
  }

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}